

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseModuleField(WastParser *this,Module *module)

{
  TokenType TVar1;
  Module *module_local;
  WastParser *this_local;
  
  TVar1 = Peek(this,1);
  switch(TVar1) {
  case Data:
    this_local._4_4_ = ParseDataModuleField(this,module);
    break;
  case Elem:
    this_local._4_4_ = ParseElemModuleField(this,module);
    break;
  default:
    __assert_fail("!\"ParseModuleField should only be called if IsModuleField() is true\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/wast-parser.cc"
                  ,800,"Result wabt::WastParser::ParseModuleField(Module *)");
  case Except:
    this_local._4_4_ = ParseExceptModuleField(this,module);
    break;
  case Export:
    this_local._4_4_ = ParseExportModuleField(this,module);
    break;
  case Func:
    this_local._4_4_ = ParseFuncModuleField(this,module);
    break;
  case Global:
    this_local._4_4_ = ParseGlobalModuleField(this,module);
    break;
  case Import:
    this_local._4_4_ = ParseImportModuleField(this,module);
    break;
  case Memory:
    this_local._4_4_ = ParseMemoryModuleField(this,module);
    break;
  case Start:
    this_local._4_4_ = ParseStartModuleField(this,module);
    break;
  case Table:
    this_local._4_4_ = ParseTableModuleField(this,module);
    break;
  case Last_Bare:
    this_local._4_4_ = ParseTypeModuleField(this,module);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseModuleField(Module* module) {
  WABT_TRACE(ParseModuleField);
  switch (Peek(1)) {
    case TokenType::Data:   return ParseDataModuleField(module);
    case TokenType::Elem:   return ParseElemModuleField(module);
    case TokenType::Except: return ParseExceptModuleField(module);
    case TokenType::Export: return ParseExportModuleField(module);
    case TokenType::Func:   return ParseFuncModuleField(module);
    case TokenType::Type:   return ParseTypeModuleField(module);
    case TokenType::Global: return ParseGlobalModuleField(module);
    case TokenType::Import: return ParseImportModuleField(module);
    case TokenType::Memory: return ParseMemoryModuleField(module);
    case TokenType::Start:  return ParseStartModuleField(module);
    case TokenType::Table:  return ParseTableModuleField(module);
    default:
      assert(
          !"ParseModuleField should only be called if IsModuleField() is true");
      return Result::Error;
  }
}